

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::PlotShadedEx<ImPlot::GetterFuncPtr,ImPlot::GetterFuncPtr>
               (char *label_id,GetterFuncPtr *getter1,GetterFuncPtr *getter2)

{
  int iVar1;
  ImPlotContext *pIVar2;
  bool bVar3;
  ImU32 col;
  ImDrawList *DrawList;
  int i;
  int iVar4;
  ImPlotPoint p2;
  ImPlotPoint p1;
  
  bVar3 = BeginItem(label_id,1);
  if (bVar3) {
    if (GImPlot->FitThisFrame == true) {
      iVar4 = 0;
      while( true ) {
        iVar1 = getter2->Count;
        if (getter1->Count < getter2->Count) {
          iVar1 = getter1->Count;
        }
        if (iVar1 <= iVar4) break;
        p1.x = (double)(*getter1->Getter)(getter1->Data,iVar4);
        p2.x = (double)(*getter2->Getter)(getter2->Data,iVar4);
        FitPoint(&p1);
        FitPoint(&p2);
        iVar4 = iVar4 + 1;
      }
    }
    pIVar2 = GImPlot;
    DrawList = GetPlotDrawList();
    if ((pIVar2->NextItemData).RenderFill == true) {
      col = ImGui::GetColorU32((pIVar2->NextItemData).Colors + 1);
      iVar4 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar4]) {
      case 0:
        p2.x = (double)CONCAT44(p2.x._4_4_,iVar4);
        ShadedRenderer<ImPlot::GetterFuncPtr,_ImPlot::GetterFuncPtr,_ImPlot::TransformerLinLin>::
        ShadedRenderer((ShadedRenderer<ImPlot::GetterFuncPtr,_ImPlot::GetterFuncPtr,_ImPlot::TransformerLinLin>
                        *)&p1,getter1,getter2,(TransformerLinLin *)&p2,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterFuncPtr,ImPlot::GetterFuncPtr,ImPlot::TransformerLinLin>>
                  ((ShadedRenderer<ImPlot::GetterFuncPtr,_ImPlot::GetterFuncPtr,_ImPlot::TransformerLinLin>
                    *)&p1,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 1:
        p2.x = (double)CONCAT44(p2.x._4_4_,iVar4);
        ShadedRenderer<ImPlot::GetterFuncPtr,_ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLin>::
        ShadedRenderer((ShadedRenderer<ImPlot::GetterFuncPtr,_ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLin>
                        *)&p1,getter1,getter2,(TransformerLogLin *)&p2,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterFuncPtr,ImPlot::GetterFuncPtr,ImPlot::TransformerLogLin>>
                  ((ShadedRenderer<ImPlot::GetterFuncPtr,_ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLin>
                    *)&p1,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 2:
        p2.x = (double)CONCAT44(p2.x._4_4_,iVar4);
        ShadedRenderer<ImPlot::GetterFuncPtr,_ImPlot::GetterFuncPtr,_ImPlot::TransformerLinLog>::
        ShadedRenderer((ShadedRenderer<ImPlot::GetterFuncPtr,_ImPlot::GetterFuncPtr,_ImPlot::TransformerLinLog>
                        *)&p1,getter1,getter2,(TransformerLinLog *)&p2,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterFuncPtr,ImPlot::GetterFuncPtr,ImPlot::TransformerLinLog>>
                  ((ShadedRenderer<ImPlot::GetterFuncPtr,_ImPlot::GetterFuncPtr,_ImPlot::TransformerLinLog>
                    *)&p1,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 3:
        p2.x = (double)CONCAT44(p2.x._4_4_,iVar4);
        ShadedRenderer<ImPlot::GetterFuncPtr,_ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLog>::
        ShadedRenderer((ShadedRenderer<ImPlot::GetterFuncPtr,_ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLog>
                        *)&p1,getter1,getter2,(TransformerLogLog *)&p2,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterFuncPtr,ImPlot::GetterFuncPtr,ImPlot::TransformerLogLog>>
                  ((ShadedRenderer<ImPlot::GetterFuncPtr,_ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLog>
                    *)&p1,DrawList,&GImPlot->CurrentPlot->PlotRect);
      }
    }
    EndItem();
  }
  return;
}

Assistant:

inline void PlotShadedEx(const char* label_id, const Getter1& getter1, const Getter2& getter2) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        if (FitThisFrame()) {
            for (int i = 0; i < ImMin(getter1.Count, getter2.Count); ++i) {
                ImPlotPoint p1 = getter1(i);
                ImPlotPoint p2 = getter2(i);
                FitPoint(p1);
                FitPoint(p2);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList & DrawList = *GetPlotDrawList();
        if (s.RenderFill) {
            ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLin>(getter1,getter2,TransformerLinLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLin>(getter1,getter2,TransformerLogLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LinLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLog>(getter1,getter2,TransformerLinLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLog>(getter1,getter2,TransformerLogLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
            }
        }
        EndItem();
    }
}